

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O3

blow_effect * lookup_monster_blow_effect(char *eff_name)

{
  blow_effect **ppbVar1;
  int iVar2;
  blow_effect *pbVar3;
  
  pbVar3 = blow_effects;
  if (blow_effects != (blow_effect *)0x0) {
    do {
      iVar2 = strcmp(pbVar3->name,eff_name);
      if (iVar2 == 0) {
        return pbVar3;
      }
      ppbVar1 = &pbVar3->next;
      pbVar3 = *ppbVar1;
    } while (*ppbVar1 != (blow_effect *)0x0);
  }
  return (blow_effect *)0x0;
}

Assistant:

struct blow_effect *lookup_monster_blow_effect(const char *eff_name) {
	struct blow_effect *eff = &blow_effects[0];
	while (eff) {
		if (streq(eff->name, eff_name))
			break;
		eff = eff->next;
	}
	return eff;
}